

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

uint ncnn::get_elf_hwcap(void)

{
  uint uVar1;
  
  uVar1 = get_elf_hwcap_from_proc_self_auxv();
  return uVar1;
}

Assistant:

static unsigned int get_elf_hwcap()
{
#if defined __ANDROID__
    unsigned int hwcap = get_elf_hwcap_from_getauxval();
    if (hwcap)
        return hwcap;
#endif

    return get_elf_hwcap_from_proc_self_auxv();
}